

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O0

result_type
asio::traits::
query_static_constexpr_member<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>,_asio::execution::detail::outstanding_work::untracked_t<0>,_void>
::value(void)

{
  undefined8 in_RAX;
  outstanding_work_t<0> local_4;
  
  local_4.value_ = (int)((ulong)in_RAX >> 0x20);
  execution::detail::outstanding_work_t<0>::outstanding_work_t(&local_4);
  return (result_type)local_4.value_;
}

Assistant:

value() ASIO_NOEXCEPT
  {
    return (Bits & outstanding_work_tracked)
      ? execution::outstanding_work_t(execution::outstanding_work.tracked)
      : execution::outstanding_work_t(execution::outstanding_work.untracked);
  }